

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O3

int CVodeSetConstraints(void *cvode_mem,N_Vector constraints)

{
  N_Vector_Ops p_Var1;
  undefined8 uVar2;
  int line;
  int iVar3;
  int error_code;
  char *msgfmt;
  double dVar4;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar3 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x3c0;
  }
  else {
    if (constraints == (N_Vector)0x0) {
      if (*(int *)((long)cvode_mem + 0x84c) != 0) {
        N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x1f8));
        *(long *)((long)cvode_mem + 0x718) =
             *(long *)((long)cvode_mem + 0x718) - *(long *)((long)cvode_mem + 0x6f8);
        *(long *)((long)cvode_mem + 0x720) =
             *(long *)((long)cvode_mem + 0x720) - *(long *)((long)cvode_mem + 0x700);
      }
      *(undefined4 *)((long)cvode_mem + 0x84c) = 0;
      *(undefined4 *)((long)cvode_mem + 0x58) = 0;
      return 0;
    }
    p_Var1 = constraints->ops;
    if ((((p_Var1->nvdiv == (_func_void_N_Vector_N_Vector_N_Vector *)0x0) ||
         (p_Var1->nvmaxnorm == (_func_sunrealtype_N_Vector *)0x0)) ||
        (p_Var1->nvcompare == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0)) ||
       ((p_Var1->nvconstrmask == (_func_int_N_Vector_N_Vector_N_Vector *)0x0 ||
        (p_Var1->nvminquotient == (_func_sunrealtype_N_Vector_N_Vector *)0x0)))) {
      msgfmt = "A required vector operation is not implemented.";
      iVar3 = -0x16;
      error_code = -0x16;
      line = 0x3db;
    }
    else {
      dVar4 = (double)N_VMaxNorm(constraints);
      if ((dVar4 <= 2.5) && (0.5 <= dVar4)) {
        if (*(int *)((long)cvode_mem + 0x84c) == 0) {
          uVar2 = N_VClone(constraints);
          *(undefined8 *)((long)cvode_mem + 0x1f8) = uVar2;
          *(long *)((long)cvode_mem + 0x718) =
               *(long *)((long)cvode_mem + 0x718) + *(long *)((long)cvode_mem + 0x6f8);
          *(long *)((long)cvode_mem + 0x720) =
               *(long *)((long)cvode_mem + 0x720) + *(long *)((long)cvode_mem + 0x700);
          *(undefined4 *)((long)cvode_mem + 0x84c) = 1;
        }
        else {
          uVar2 = *(undefined8 *)((long)cvode_mem + 0x1f8);
        }
        N_VScale(0x3ff0000000000000,constraints,uVar2);
        *(undefined4 *)((long)cvode_mem + 0x58) = 1;
        return 0;
      }
      msgfmt = "Illegal values in constraints vector.";
      iVar3 = -0x16;
      error_code = -0x16;
      line = 0x3e4;
    }
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeSetConstraints",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return iVar3;
}

Assistant:

int CVodeSetConstraints(void* cvode_mem, N_Vector constraints)
{
  CVodeMem cv_mem;
  sunrealtype temptest;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  /* If there are no constraints, destroy data structures */
  if (constraints == NULL)
  {
    if (cv_mem->cv_constraintsMallocDone)
    {
      N_VDestroy(cv_mem->cv_constraints);
      cv_mem->cv_lrw -= cv_mem->cv_lrw1;
      cv_mem->cv_liw -= cv_mem->cv_liw1;
    }
    cv_mem->cv_constraintsMallocDone = SUNFALSE;
    cv_mem->cv_constraintsSet        = SUNFALSE;
    return (CV_SUCCESS);
  }

  /* Test if required vector ops. are defined */

  if (constraints->ops->nvdiv == NULL || constraints->ops->nvmaxnorm == NULL ||
      constraints->ops->nvcompare == NULL ||
      constraints->ops->nvconstrmask == NULL ||
      constraints->ops->nvminquotient == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_NVECTOR);
    return (CV_ILL_INPUT);
  }

  /* Check the constraints vector */
  temptest = N_VMaxNorm(constraints);
  if ((temptest > TWOPT5) || (temptest < HALF))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_CONSTR);
    return (CV_ILL_INPUT);
  }

  if (!(cv_mem->cv_constraintsMallocDone))
  {
    cv_mem->cv_constraints = N_VClone(constraints);
    cv_mem->cv_lrw += cv_mem->cv_lrw1;
    cv_mem->cv_liw += cv_mem->cv_liw1;
    cv_mem->cv_constraintsMallocDone = SUNTRUE;
  }

  /* Load the constraints vector */
  N_VScale(ONE, constraints, cv_mem->cv_constraints);

  cv_mem->cv_constraintsSet = SUNTRUE;

  return (CV_SUCCESS);
}